

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void * sexp_try_alloc(sexp_conflict ctx,size_t size)

{
  long *plVar1;
  ulong in_RSI;
  long in_RDI;
  sexp_heap_conflict h;
  sexp_free_list_conflict ls3;
  sexp_free_list_conflict ls2;
  sexp_free_list_conflict ls1;
  long local_38;
  ulong *local_28;
  ulong *local_20;
  
  local_38 = *(long *)(in_RDI + 0x70);
  do {
    if (local_38 == 0) {
      return (void *)0x0;
    }
    local_20 = *(ulong **)(local_38 + 0x18);
    for (local_28 = (ulong *)local_20[1]; local_28 != (ulong *)0x0; local_28 = (ulong *)local_28[1])
    {
      if (in_RSI <= *local_28) {
        if (*local_28 < in_RSI + 0x20) {
          local_20[1] = local_28[1];
        }
        else {
          plVar1 = (long *)((long)local_28 + in_RSI);
          *plVar1 = *local_28 - in_RSI;
          plVar1[1] = local_28[1];
          local_20[1] = (ulong)plVar1;
        }
        memset(local_28,0,in_RSI);
        return local_28;
      }
      local_20 = local_28;
    }
    local_38 = *(long *)(local_38 + 0x20);
  } while( true );
}

Assistant:

void* sexp_try_alloc (sexp ctx, size_t size) {
  sexp_free_list ls1, ls2, ls3;
  sexp_heap h;
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
  int found_fixed = 0;
#endif
  for (h=sexp_context_heap(ctx); h; h=h->next) {
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    if (h->chunk_size) {
      if (h->chunk_size != size)
        continue;
      found_fixed = 1;
    } else if (found_fixed) {   /* don't use a non-fixed heap */
      return NULL;
    }
#endif
    for (ls1=h->free_list, ls2=ls1->next; ls2; ls1=ls2, ls2=ls2->next) {
      if (ls2->size >= size) {
#if SEXP_USE_DEBUG_GC > 1
        ls3 = (sexp_free_list) sexp_heap_end(h);
        if (ls2 >= ls3)
          fprintf(stderr, "alloced %lu bytes past end of heap: %p (%lu) >= %p"
                  " next: %p (%lu)\n", size, ls2, ls2->size, ls3, ls2->next,
                  (ls2->next ? ls2->next->size : 0));
#endif
        if (ls2->size >= (size + SEXP_MINIMUM_OBJECT_SIZE)) {
          ls3 = (sexp_free_list) (((char*)ls2)+size); /* the tail after ls2 */
          ls3->size = ls2->size - size;
          ls3->next = ls2->next;
          ls1->next = ls3;
        } else {                  /* take the whole chunk */
          ls1->next = ls2->next;
        }
        memset((void*)ls2, 0, size);
        return ls2;
      }
    }
  }
  return NULL;
}